

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O2

bool QLocalSocketPrivate::parseSockaddr
               (sockaddr_un *addr,uint len,QString *fullServerName,QString *serverName,
               bool *abstractNamespace)

{
  char16_t cVar1;
  Data *pDVar2;
  uint uVar3;
  bool bVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  code *local_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  long local_38;
  char *pcVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (2 < len) {
    bVar5 = addr->sun_path[0] == '\0' && addr->sun_family == 1;
    *abstractNamespace = bVar5;
    local_70 = QtPrivate::indexOf;
    local_68 = 1;
    local_64 = 0;
    uStack_5c = 0;
    uStack_58 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    uStack_40 = 0;
    local_a8.size = (qsizetype)(addr->sun_path + bVar5);
    local_a8.ptr = (char16_t *)(ulong)((len - bVar5) - 2);
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d = (Data *)&local_70;
    QStringDecoder::EncodedData::operator_cast_to_QString
              ((QString *)&local_88,(EncodedData *)&local_a8);
    if (((char *)local_88.size != (char *)0x0) && (CONCAT44(uStack_54,uStack_58) == 0)) {
      if ((*abstractNamespace == false) && (local_88.ptr[(long)(local_88.size + -1)] == L'\0')) {
        pcVar6 = local_88.ptr + ((local_88.size & 0xffffffffU) - 2);
        pcVar4 = (char *)local_88.size;
        do {
          uVar3 = (int)pcVar4 - 1;
          pcVar4 = (char *)(ulong)uVar3;
          if ((int)uVar3 < 1) break;
          cVar1 = *pcVar6;
          pcVar6 = pcVar6 + -1;
        } while (cVar1 == L'\0');
        QString::truncate((longlong)&local_88);
      }
      QString::operator=(fullServerName,(QString *)&local_88);
      if (*abstractNamespace == true) {
        local_a8.d = local_88.d;
        local_a8.ptr = local_88.ptr;
        local_a8.size = local_88.size;
        if (local_88.d != (Data *)0x0) {
          LOCK();
          ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        QString::lastIndexOf(fullServerName,(QChar)0x2f,CaseSensitive);
        QString::mid((longlong)&local_a8,(longlong)fullServerName);
      }
      pDVar2 = (serverName->d).d;
      pcVar6 = (serverName->d).ptr;
      (serverName->d).d = local_a8.d;
      (serverName->d).ptr = local_a8.ptr;
      pcVar4 = (char *)(serverName->d).size;
      (serverName->d).size = local_a8.size;
      local_a8.d = pDVar2;
      local_a8.ptr = pcVar6;
      local_a8.size = (qsizetype)pcVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      if ((serverName->d).size == 0) {
        QString::operator=(serverName,(QString *)fullServerName);
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QStringConverterBase::State::clear();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return 2 < len;
}

Assistant:

bool QLocalSocketPrivate::parseSockaddr(const struct ::sockaddr_un &addr,
                                        uint len,
                                        QString &fullServerName,
                                        QString &serverName,
                                        bool &abstractNamespace)
{
    if (len <= offsetof(::sockaddr_un, sun_path))
        return false;
    len -= offsetof(::sockaddr_un, sun_path);
    // check for abstract socket address
    abstractNamespace = PlatformSupportsAbstractNamespace
                                 && (addr.sun_family == PF_UNIX && addr.sun_path[0] == 0);
    QStringDecoder toUtf16(QStringDecoder::System, QStringDecoder::Flag::Stateless);
    // An abstract socket address can be arbitrary binary. To properly handle such a case,
    // we'd have to add new access functions for this very specific case. Instead, we just
    // attempt to decode it according to OS text encoding. If it fails we ignore the result.
    QByteArrayView textData(addr.sun_path + (abstractNamespace ? 1 : 0),
                            len - (abstractNamespace ? 1 : 0));
    QString name = toUtf16(textData);
    if (!name.isEmpty() && !toUtf16.hasError()) {
        //conversion encodes the trailing zeros. So, in case of non-abstract namespace we
        //chop them off as \0 character is not allowed in filenames
        if (!abstractNamespace && (name.at(name.size() - 1) == QChar::fromLatin1('\0'))) {
            int truncPos = name.size() - 1;
            while (truncPos > 0 && name.at(truncPos - 1) == QChar::fromLatin1('\0'))
                truncPos--;
            name.truncate(truncPos);
        }
        fullServerName = name;
        serverName = abstractNamespace
                     ? name
                     : fullServerName.mid(fullServerName.lastIndexOf(u'/') + 1);
        if (serverName.isEmpty())
            serverName = fullServerName;
    }
    return true;
}